

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O3

uint HUF_optimalTableLog(uint maxTableLog,size_t srcSize,uint maxSymbolValue,void *workSpace,
                        size_t wkspSize,HUF_CElt *table,uint *count,int flags)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint local_60;
  
  if (srcSize < 2) {
    __assert_fail("srcSize > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                  ,0x4e0,
                  "unsigned int HUF_optimalTableLog(unsigned int, size_t, unsigned int, void *, size_t, HUF_CElt *, const unsigned int *, int)"
                 );
  }
  if (wkspSize < 0x1300) {
    __assert_fail("wkspSize >= sizeof(HUF_buildCTable_wksp_tables)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                  ,0x4e1,
                  "unsigned int HUF_optimalTableLog(unsigned int, size_t, unsigned int, void *, size_t, HUF_CElt *, const unsigned int *, int)"
                 );
  }
  if ((flags & 2U) == 0) {
    uVar1 = FSE_optimalTableLog_internal(maxTableLog,srcSize,maxSymbolValue,1);
    return uVar1;
  }
  uVar1 = maxSymbolValue + 1;
  if (uVar1 != 0) {
    uVar4 = 0;
    uVar2 = 0;
    do {
      uVar2 = (uVar2 + 1) - (uint)(count[uVar4] == 0);
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
    if (uVar2 != 0) {
      uVar6 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> uVar6 == 0; uVar6 = uVar6 - 1) {
        }
      }
      uVar2 = (uVar6 ^ 0xffffffe0) + 0x21;
      local_60 = maxTableLog;
      if (uVar2 <= maxTableLog) {
        uVar4 = 0xfffffffffffffffe;
        uVar6 = uVar2;
        do {
          sVar3 = HUF_buildCTable_wksp(table,count,maxSymbolValue,uVar6,workSpace,wkspSize);
          if (sVar3 < 0xffffffffffffff89) {
            if (sVar3 < uVar6 && uVar2 < uVar6) break;
            sVar3 = HUF_writeCTable_wksp
                              ((void *)((long)workSpace + 0x2ec),wkspSize - 0x2ec,table,
                               maxSymbolValue,(uint)sVar3,workSpace,wkspSize);
            if (sVar3 < 0xffffffffffffff89) {
              if ((int)maxSymbolValue < 0) {
                uVar5 = 0;
              }
              else {
                uVar7 = 0;
                uVar5 = 0;
                do {
                  uVar5 = uVar5 + (ulong)count[uVar7] * (ulong)(byte)table[uVar7 + 1];
                  uVar7 = uVar7 + 1;
                } while (uVar1 != uVar7);
                uVar5 = uVar5 >> 3;
              }
              uVar5 = uVar5 + sVar3;
              if (uVar4 + 1 < uVar5) break;
              if (uVar5 < uVar4) {
                uVar4 = uVar5;
                local_60 = uVar6;
              }
            }
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 <= maxTableLog);
      }
      if (local_60 < 0xd) {
        return local_60;
      }
      __assert_fail("optLog <= HUF_TABLELOG_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                    ,0x509,
                    "unsigned int HUF_optimalTableLog(unsigned int, size_t, unsigned int, void *, size_t, HUF_CElt *, const unsigned int *, int)"
                   );
    }
  }
  __assert_fail("val != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/bits.h"
                ,0xab,"unsigned int ZSTD_highbit32(U32)");
}

Assistant:

unsigned HUF_optimalTableLog(
            unsigned maxTableLog,
            size_t srcSize,
            unsigned maxSymbolValue,
            void* workSpace, size_t wkspSize,
            HUF_CElt* table,
      const unsigned* count,
            int flags)
{
    assert(srcSize > 1); /* Not supported, RLE should be used instead */
    assert(wkspSize >= sizeof(HUF_buildCTable_wksp_tables));

    if (!(flags & HUF_flags_optimalDepth)) {
        /* cheap evaluation, based on FSE */
        return FSE_optimalTableLog_internal(maxTableLog, srcSize, maxSymbolValue, 1);
    }

    {   BYTE* dst = (BYTE*)workSpace + sizeof(HUF_WriteCTableWksp);
        size_t dstSize = wkspSize - sizeof(HUF_WriteCTableWksp);
        size_t maxBits, hSize, newSize;
        const unsigned symbolCardinality = HUF_cardinality(count, maxSymbolValue);
        const unsigned minTableLog = HUF_minTableLog(symbolCardinality);
        size_t optSize = ((size_t) ~0) - 1;
        unsigned optLog = maxTableLog, optLogGuess;

        DEBUGLOG(6, "HUF_optimalTableLog: probing huf depth (srcSize=%zu)", srcSize);

        /* Search until size increases */
        for (optLogGuess = minTableLog; optLogGuess <= maxTableLog; optLogGuess++) {
            DEBUGLOG(7, "checking for huffLog=%u", optLogGuess);
            maxBits = HUF_buildCTable_wksp(table, count, maxSymbolValue, optLogGuess, workSpace, wkspSize);
            if (ERR_isError(maxBits)) continue;

            if (maxBits < optLogGuess && optLogGuess > minTableLog) break;

            hSize = HUF_writeCTable_wksp(dst, dstSize, table, maxSymbolValue, (U32)maxBits, workSpace, wkspSize);

            if (ERR_isError(hSize)) continue;

            newSize = HUF_estimateCompressedSize(table, count, maxSymbolValue) + hSize;

            if (newSize > optSize + 1) {
                break;
            }

            if (newSize < optSize) {
                optSize = newSize;
                optLog = optLogGuess;
            }
        }
        assert(optLog <= HUF_TABLELOG_MAX);
        return optLog;
    }
}